

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O2

void __thiscall Array<unsigned_int>::append(Array<unsigned_int> *this,uint *values,usize size)

{
  uint *puVar1;
  uint *puVar2;
  
  reserve(this,((long)(this->_end).item - (long)(this->_begin).item >> 2) + size);
  puVar2 = (this->_end).item;
  puVar1 = puVar2 + size;
  for (; puVar2 < puVar1; puVar2 = puVar2 + 1) {
    *puVar2 = *values;
    values = values + 1;
  }
  (this->_end).item = puVar2;
  return;
}

Assistant:

void append(const T* values, usize size)
  {
    usize oldSize = _end.item - _begin.item;
    reserve(oldSize + size);
    T* item = _end.item;
    for(T* end = item + size; item < end; ++item, ++values)
    {
#ifdef VERIFY
      VERIFY(new(item) T(*values) == item);
#else
      new(item) T(*values);
#endif
    }
    _end.item = item;
  }